

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void calc4::EmitCppCode<int>
               (shared_ptr<const_calc4::Operator> *op,CompilationContext *context,ostream *ostream)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  basic_string_view<char,_std::char_traits<char>_> __str_07;
  UserDefinedVariableName name;
  basic_string_view<char,_std::char_traits<char>_> __str_08;
  basic_string_view<char,_std::char_traits<char>_> __str_09;
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *context_00;
  ostream *poVar4;
  OperatorInformation *info_00;
  pointer ppVar5;
  ostream *this;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  *__lhs;
  reference pOVar6;
  ostream *in_RDX;
  string_view sVar7;
  OperatorInformation *info_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> *variableName;
  iterator __end3;
  iterator __begin3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  variableNames;
  OperatorInformation *info;
  iterator __end2;
  iterator __begin2;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  *__range2;
  const_iterator it;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  infos;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffcd8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  OperatorDefinition *in_stack_fffffffffffffcf0;
  OperatorDefinition *in_stack_fffffffffffffcf8;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  ostream *in_stack_fffffffffffffd48;
  OperatorInformation *in_stack_fffffffffffffd50;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  local_228;
  undefined1 *local_220;
  undefined8 local_218;
  char *pcStack_210;
  undefined8 local_208;
  char *pcStack_200;
  size_t local_1f8;
  char *pcStack_1f0;
  UserDefinedVariableName local_1e0;
  string_view local_1d0;
  string_view *local_1c0;
  _Self local_1b8;
  _Self local_1b0;
  undefined1 *local_1a8;
  undefined1 local_1a0 [48];
  reference local_170;
  OperatorInformation *local_168;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  local_160;
  undefined1 *local_158;
  OperatorInformation *local_148;
  OperatorInformation *local_140;
  OperatorInformation *local_138;
  _Base_ptr local_130;
  undefined1 local_121;
  _Self local_120;
  _Self local_118;
  undefined1 local_10d;
  allocator<char> local_f9;
  string local_f8 [72];
  undefined1 local_b0 [24];
  undefined8 local_98;
  char *pcStack_90;
  string_view local_88;
  string_view local_78;
  undefined8 local_68;
  char *pcStack_60;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  ostream *local_18;
  
  local_18 = in_RDX;
  poVar2 = std::operator<<(in_RDX,"#include <cstdint>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_18,"#include <iostream>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_18,"#include <unordered_map>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_18,"std::unordered_map<");
  local_28 = anon_unknown_0::TypeName<int>();
  __str._M_str = (char *)in_stack_fffffffffffffcf0;
  __str._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str);
  poVar2 = std::operator<<(pbVar3,", ");
  local_38 = anon_unknown_0::TypeName<int>();
  __str_00._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_00._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_00);
  context_00 = std::operator<<(pbVar3,"> ");
  local_48 = anon_unknown_0::MemoryFieldName();
  __str_01._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_01._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_01);
  poVar4 = std::operator<<(pbVar3,';');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  info_00 = (OperatorInformation *)std::operator<<(local_18,"int ");
  local_58 = anon_unknown_0::GetCharFunctionName();
  __str_02._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_02._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_02);
  poVar4 = std::operator<<(pbVar3,"()");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_18,"{");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_68 = 4;
  pcStack_60 = "    ";
  __str_03._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_03._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_03);
  poVar4 = std::operator<<(pbVar3,"return std::cin.get();");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_18,"}");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_18,"void ");
  local_78 = anon_unknown_0::PrintFunctionName();
  __str_04._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_04._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_04);
  std::operator<<(pbVar3,"(");
  local_88 = anon_unknown_0::TypeName<int>();
  __str_05._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_05._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_05);
  poVar4 = std::operator<<(pbVar3," value)");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_18,'{');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_98 = 4;
  pcStack_90 = "    ";
  __str_06._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_06._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_06);
  poVar4 = std::operator<<(pbVar3,"std::cout << static_cast<char>(value);");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_18,'}');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::vector((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
            *)0x1397e5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  OperatorDefinition::OperatorDefinition
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_10d = 1;
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
  ::emplace_back<calc4::OperatorDefinition,std::shared_ptr<calc4::Operator_const>const&,bool>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (shared_ptr<const_calc4::Operator> *)in_stack_fffffffffffffcf0,
             (bool *)in_stack_fffffffffffffce8);
  OperatorDefinition::~OperatorDefinition((OperatorDefinition *)0x13986d);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_118._M_node =
       (_Base_ptr)
       CompilationContext::UserDefinedOperatorBegin_abi_cxx11_
                 ((CompilationContext *)in_stack_fffffffffffffcd8);
  while( true ) {
    local_120._M_node =
         (_Base_ptr)
         CompilationContext::UserDefinedOperatorEnd_abi_cxx11_
                   ((CompilationContext *)in_stack_fffffffffffffcd8);
    bVar1 = std::operator!=(&local_118,&local_120);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x139900);
    OperatorImplement::GetDefinition(&ppVar5->second);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x139923);
    OperatorImplement::GetOperator(&ppVar5->second);
    local_121 = 0;
    std::
    vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
    ::
    emplace_back<calc4::OperatorDefinition_const&,std::shared_ptr<calc4::Operator_const>const&,bool>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (shared_ptr<const_calc4::Operator> *)in_stack_fffffffffffffcf0,
               (bool *)in_stack_fffffffffffffce8);
    local_130 = (_Base_ptr)
                std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                              *)in_stack_fffffffffffffce8,
                             (int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  }
  local_140 = (OperatorInformation *)
              std::
              vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
              ::begin((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                       *)in_stack_fffffffffffffcd8);
  local_138 = (OperatorInformation *)
              __gnu_cxx::
              __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
              ::operator+((__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
                           *)in_stack_fffffffffffffce8,(difference_type)in_stack_fffffffffffffce0);
  local_148 = (OperatorInformation *)
              std::
              vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
              ::end((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                     *)in_stack_fffffffffffffcd8);
  std::
  sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,calc4::EmitCppCode<int>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>
            (local_138,local_148);
  local_158 = local_b0;
  local_160._M_current =
       (OperatorInformation *)
       std::
       vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
       ::begin((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                *)in_stack_fffffffffffffcd8);
  local_168 = (OperatorInformation *)
              std::
              vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
              ::end((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                     *)in_stack_fffffffffffffcd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
                        *)in_stack_fffffffffffffce0,
                       (__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (!bVar1) break;
    local_170 = __gnu_cxx::
                __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
                ::operator*(&local_160);
    anon_unknown_0::EmitDeclaration<int>(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    poVar4 = std::operator<<(local_18,';');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
    ::operator++(&local_160);
  }
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  anon_unknown_0::GatherVariableNames
            ((shared_ptr<const_calc4::Operator> *)in_stack_fffffffffffffd18,
             (CompilationContext *)in_stack_fffffffffffffd10);
  bVar1 = std::
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)0x139b77);
  if (!bVar1) {
    local_1a8 = local_1a0;
    local_1b0._M_node =
         (_Base_ptr)
         std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin(in_stack_fffffffffffffcd8);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(in_stack_fffffffffffffcd8);
    while( true ) {
      bVar1 = std::operator!=(&local_1b0,&local_1b8);
      if (!bVar1) break;
      local_1c0 = std::
                  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
                  operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x139be4);
      sVar7 = anon_unknown_0::TypeName<int>();
      __str_07._M_str = (char *)in_stack_fffffffffffffcf0;
      __str_07._M_len = (size_t)in_stack_fffffffffffffce8;
      local_1d0 = sVar7;
      pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_07);
      std::operator<<(pbVar3,' ');
      local_1f8 = local_1c0->_M_len;
      pcStack_1f0 = local_1c0->_M_str;
      anon_unknown_0::UserDefinedVariableName::UserDefinedVariableName(&local_1e0,*local_1c0);
      name.name._M_str = (char *)in_stack_fffffffffffffcf0;
      name.name._M_len = (size_t)in_stack_fffffffffffffce8;
      poVar4 = anon_unknown_0::operator<<(in_stack_fffffffffffffce0,name);
      poVar4 = std::operator<<(poVar4," = 0;");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
      operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 in_stack_fffffffffffffce0);
    }
    std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<(local_18,"int main()");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_18,'{');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_208 = 4;
  pcStack_200 = "    ";
  __str_08._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_08._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_08);
  std::operator<<(pbVar3,"std::cout << ");
  local_218 = 0xd;
  pcStack_210 = "main_operator";
  __str_09._M_str = (char *)in_stack_fffffffffffffcf0;
  __str_09._M_len = (size_t)in_stack_fffffffffffffce8;
  pbVar3 = std::operator<<(in_stack_fffffffffffffce0,__str_09);
  poVar4 = std::operator<<(pbVar3,"() << std::endl;");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  this = std::operator<<(local_18,'}');
  __lhs = (__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
           *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  local_220 = local_b0;
  local_228._M_current =
       (OperatorInformation *)
       std::
       vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
       ::begin((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                *)in_stack_fffffffffffffcd8);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::end((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
         *)in_stack_fffffffffffffcd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
                              *)in_stack_fffffffffffffcd8);
    if (!bVar1) break;
    pOVar6 = __gnu_cxx::
             __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
             ::operator*(&local_228);
    if ((pOVar6->isMain & 1U) == 0) {
      std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
    }
    anon_unknown_0::EmitOperator<int>(info_00,(CompilationContext *)context_00,poVar2);
    __gnu_cxx::
    __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
    ::operator++(&local_228);
  }
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)0x139f3f);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::~vector((vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
             *)poVar4);
  return;
}

Assistant:

void EmitCppCode(const std::shared_ptr<const Operator>& op, const CompilationContext& context,
                 std::ostream& ostream)
{
    /* Emit header */
    ostream << "#include <cstdint>" << std::endl;

#ifdef ENABLE_GMP
    if constexpr (std::is_same_v<TNumber, mpz_class>)
    {
        ostream << "#include <gmpxx.h>" << std::endl;
    }
#endif // ENABLE_GMP

    ostream << "#include <iostream>" << std::endl;
    ostream << "#include <unordered_map>" << std::endl;
    ostream << std::endl;
    ostream << "std::unordered_map<" << TypeName<TNumber>() << ", " << TypeName<TNumber>() << "> "
            << MemoryFieldName() << ';' << std::endl;
    ostream << std::endl;
    ostream << "int " << GetCharFunctionName() << "()" << std::endl;
    ostream << "{" << std::endl;
    ostream << IndentText << "return std::cin.get();" << std::endl;
    ostream << "}" << std::endl;
    ostream << std::endl;
    ostream << "void " << PrintFunctionName() << "(" << TypeName<TNumber>() << " value)"
            << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << static_cast<char>(value);" << std::endl;
    ostream << '}' << std::endl;
    ostream << std::endl;

    /* Gather information of operators and sort */
    std::vector<OperatorInformation> infos;
    infos.emplace_back(OperatorDefinition(std::string(MainOperatorName), 0), op, true);

    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        infos.emplace_back(it->second.GetDefinition(), it->second.GetOperator(), false);
    }

    std::sort(infos.begin() + 1, infos.end(), [](auto& left, auto& right) {
        return left.definition.GetName() < right.definition.GetName();
    });

    /* Emit forward declarations */
    for (auto& info : infos)
    {
        EmitDeclaration<TNumber>(info, ostream);
        ostream << ';' << std::endl;
    }

    ostream << std::endl;

    /* Gather variable names */
    std::set<std::string_view> variableNames = GatherVariableNames(op, context);

    /* Emit variable definitions */
    if (!variableNames.empty())
    {
        for (auto& variableName : variableNames)
        {
            ostream << TypeName<TNumber>() << ' ' << UserDefinedVariableName(variableName)
                    << " = 0;" << std::endl;
        }

        ostream << std::endl;
    }

    /* Emit main */
    ostream << "int main()" << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << " << MainOperatorName << "() << std::endl;" << std::endl;
    ostream << '}' << std::endl << std::endl;

    /* Emit definitions */
    for (auto& info : infos)
    {
        if (!info.isMain)
        {
            ostream << std::endl;
        }

        EmitOperator<TNumber>(info, context, ostream);
    }
}